

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D::forward(Convolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Option *in_RDI;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  Mat bottom_blob_bordered;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  Convolution1D *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Mat *in_stack_ffffffffffffff80;
  Mat *in_stack_ffffffffffffff88;
  Mat *in_stack_ffffffffffffff90;
  int local_4c;
  int local_c;
  
  Mat::Mat((Mat *)&stack0xffffffffffffff88);
  make_padding(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Option *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar1) {
    local_c = -100;
  }
  else {
    Mat::create((Mat *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff46,
                                               CONCAT24(in_stack_ffffffffffffff44,
                                                        in_stack_ffffffffffffff40))),
                in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                (size_t)in_stack_ffffffffffffff30,(Allocator *)in_stack_ffffffffffffff28);
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (bVar1) {
      local_c = -100;
    }
    else {
      local_c = convolution1d(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              in_stack_ffffffffffffff80,
                              (Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              local_4c,in_stack_ffffffffffffff70,in_ECX,in_EDX,in_RSI,in_RDI);
      if (local_c == 0) {
        local_c = 0;
      }
    }
  }
  Mat::~Mat((Mat *)0x8f5285);
  return local_c;
}

Assistant:

int Convolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution1d(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}